

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveModel.cpp
# Opt level: O0

void __thiscall WaveModel::setDataFromString(WaveModel *this,QString *str)

{
  Waveform *this_00;
  string local_50;
  undefined1 local_30 [8];
  PermanentEditor ctx;
  QString *str_local;
  WaveModel *this_local;
  
  ctx.mModule = (Module *)str;
  Module::permanentEdit((PermanentEditor *)local_30,(this->super_GraphModel).mModule);
  this_00 = this->mWaveform;
  QString::toStdString_abi_cxx11_(&local_50,(QString *)ctx.mModule);
  trackerboy::Waveform::fromString(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Module::PermanentEditor::~PermanentEditor((PermanentEditor *)local_30);
  GraphModel::dataChanged(&this->super_GraphModel);
  return;
}

Assistant:

void WaveModel::setDataFromString(QString const& str) {
 
    {
        auto ctx = mModule.permanentEdit();
        mWaveform->fromString(str.toStdString());
    }
    emit dataChanged();
}